

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragDepthTests.cpp
# Opt level: O0

bool deqp::gles3::Functional::compare<float>(deUint32 func,float a,float b)

{
  float b_local;
  float a_local;
  deUint32 func_local;
  
  switch(func) {
  case 0x200:
    a_local._3_1_ = false;
    break;
  case 0x201:
    a_local._3_1_ = a < b;
    break;
  case 0x202:
    a_local._3_1_ = a == b;
    break;
  case 0x203:
    a_local._3_1_ = a <= b;
    break;
  case 0x204:
    a_local._3_1_ = b < a;
    break;
  case 0x205:
    a_local._3_1_ = a != b;
    break;
  case 0x206:
    a_local._3_1_ = b <= a;
    break;
  case 0x207:
    a_local._3_1_ = true;
    break;
  default:
    a_local._3_1_ = false;
  }
  return a_local._3_1_;
}

Assistant:

static inline bool compare (deUint32 func, T a, T b)
{
	switch (func)
	{
		case GL_NEVER:		return false;
		case GL_ALWAYS:		return true;
		case GL_LESS:		return a < b;
		case GL_LEQUAL:		return a <= b;
		case GL_EQUAL:		return a == b;
		case GL_NOTEQUAL:	return a != b;
		case GL_GEQUAL:		return a >= b;
		case GL_GREATER:	return a > b;
		default:
			DE_ASSERT(DE_FALSE);
			return false;
	}
}